

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

void __thiscall
SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
::insert(SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
         *this,GenericFunctionInstanceTypeRequest *key,GenericFunctionInstanceTypeResponse *value)

{
  TypeBase *pTVar1;
  FunctionData *pFVar2;
  TypeHandle *pTVar3;
  MatchData *pMVar4;
  undefined4 uVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Node *this_00;
  GenericFunctionInstanceTypeRequest local_68;
  
  local_68.hash = 0;
  local_68.parentType = (TypeBase *)0x0;
  local_68.function = (FunctionData *)0x0;
  local_68.arguments.head = (TypeHandle *)0x0;
  local_68.arguments.tail = (TypeHandle *)0x0;
  local_68.aliases.head = (MatchData *)0x0;
  local_68.aliases.tail = (MatchData *)0x0;
  bVar6 = GenericFunctionInstanceTypeRequest::operator==(key,&local_68);
  if (bVar6) {
    __assert_fail("key != Key()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0x3b,
                  "void SmallDenseMap<GenericFunctionInstanceTypeRequest, GenericFunctionInstanceTypeResponse, GenericFunctionInstanceTypeRequestHasher, 32>::insert(const Key &, const Value &) [Key = GenericFunctionInstanceTypeRequest, Value = GenericFunctionInstanceTypeResponse, Hasher = GenericFunctionInstanceTypeRequestHasher, N = 32]"
                 );
  }
  uVar9 = this->bucketCount;
  if (uVar9 <= (this->count >> 2) + this->count) {
    rehash(this);
    uVar9 = this->bucketCount;
    if (uVar9 == 0) goto LAB_00209481;
  }
  uVar8 = key->hash;
  uVar7 = 0;
  do {
    uVar8 = uVar8 & uVar9 - 1;
    this_00 = this->data + uVar8;
    local_68.hash = 0;
    local_68.aliases.head = (MatchData *)0x0;
    local_68.aliases.tail = (MatchData *)0x0;
    local_68.arguments.head = (TypeHandle *)0x0;
    local_68.arguments.tail = (TypeHandle *)0x0;
    local_68.parentType = (TypeBase *)0x0;
    local_68.function = (FunctionData *)0x0;
    bVar6 = GenericFunctionInstanceTypeRequest::operator==(&this_00->key,&local_68);
    if (bVar6) {
      (this_00->key).aliases.tail = (key->aliases).tail;
      uVar9 = key->hash;
      uVar5 = *(undefined4 *)&key->field_0x4;
      pTVar1 = key->parentType;
      pFVar2 = key->function;
      pTVar3 = (key->arguments).head;
      pMVar4 = (key->aliases).head;
      (this_00->key).arguments.tail = (key->arguments).tail;
      (this_00->key).aliases.head = pMVar4;
      (this_00->key).function = pFVar2;
      (this_00->key).arguments.head = pTVar3;
      (this_00->key).hash = uVar9;
      *(undefined4 *)&(this_00->key).field_0x4 = uVar5;
      (this_00->key).parentType = pTVar1;
      pMVar4 = (value->aliases).head;
      (this_00->value).functionType = value->functionType;
      (this_00->value).aliases.head = pMVar4;
      (this_00->value).aliases.tail = (value->aliases).tail;
      this->count = this->count + 1;
      return;
    }
    bVar6 = GenericFunctionInstanceTypeRequest::operator==(&this_00->key,key);
    if (bVar6) {
      (this_00->value).aliases.tail = (value->aliases).tail;
      pMVar4 = (value->aliases).head;
      (this_00->value).functionType = value->functionType;
      (this_00->value).aliases.head = pMVar4;
      return;
    }
    uVar8 = uVar8 + uVar7 + 1;
    uVar7 = uVar7 + 1;
  } while (uVar7 < this->bucketCount);
LAB_00209481:
  __assert_fail("!\"couldn\'t insert node\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                ,0x5b,
                "void SmallDenseMap<GenericFunctionInstanceTypeRequest, GenericFunctionInstanceTypeResponse, GenericFunctionInstanceTypeRequestHasher, 32>::insert(const Key &, const Value &) [Key = GenericFunctionInstanceTypeRequest, Value = GenericFunctionInstanceTypeResponse, Hasher = GenericFunctionInstanceTypeRequestHasher, N = 32]"
               );
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
			{
				item.key = key;
				item.value = value;

				count++;
				return;
			}

			if(item.key == key)
			{
				item.value = value;
				return;
			}

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}